

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exceptions.h
# Opt level: O0

void __thiscall
kaitai::
validation_not_equal_error<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
::validation_not_equal_error
          (validation_not_equal_error<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *this,basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *expected,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *actual,kstream *io,
          string *src_path)

{
  string *io_00;
  string local_88;
  allocator local_51;
  string local_50;
  string *local_30;
  string *src_path_local;
  kstream *io_local;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *actual_local;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *expected_local;
  validation_not_equal_error<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *this_local;
  
  local_30 = src_path;
  src_path_local = (string *)io;
  io_local = (kstream *)actual;
  actual_local = expected;
  expected_local = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_50,"not equal",&local_51);
  io_00 = src_path_local;
  std::__cxx11::string::string((string *)&local_88,(string *)src_path);
  validation_failed_error::validation_failed_error
            (&this->super_validation_failed_error,&local_50,(kstream *)io_00,&local_88);
  std::__cxx11::string::~string((string *)&local_88);
  std::__cxx11::string::~string((string *)&local_50);
  std::allocator<char>::~allocator((allocator<char> *)&local_51);
  *(undefined ***)&(this->super_validation_failed_error).super_kstruct_error =
       &PTR__validation_not_equal_error_0026fab8;
  this->m_expected = actual_local;
  this->m_actual = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)io_local;
  return;
}

Assistant:

validation_not_equal_error<T>(const T& expected, const T& actual, kstream* io, const std::string src_path):
        validation_failed_error("not equal", io, src_path),
        m_expected(expected),
        m_actual(actual)
    {
    }